

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool checkInterfaceDirs(string *prepro,cmGeneratorTarget *target,string *prop)

{
  cmMakefile *this;
  string_view str;
  __type _Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  PolicyStatus PVar5;
  string *psVar6;
  cmLocalGenerator *pcVar7;
  reference input;
  size_type sVar8;
  ostream *poVar9;
  string *psVar10;
  PolicyID id;
  PolicyID id_00;
  char *pcVar11;
  string *local_580;
  bool local_51a;
  bool local_519;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  undefined1 local_410 [8];
  ostringstream s;
  bool local_293;
  undefined1 local_290 [5];
  bool shouldContinue;
  bool inSource;
  bool inBinary;
  undefined4 local_26c;
  string local_268;
  undefined1 local_248 [8];
  ostringstream e;
  MessageType local_cc;
  MessageType messageType;
  size_t genexPos;
  string *li;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_88 [6];
  bool hadFatalError;
  bool inSourceBuild;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string *topBinaryDir;
  string *topSourceDir;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *installDir;
  string *prop_local;
  cmGeneratorTarget *target_local;
  string *prepro_local;
  
  this = target->Makefile;
  installDir = prop;
  prop_local = (string *)target;
  target_local = (cmGeneratorTarget *)prepro;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_INSTALL_PREFIX",&local_49);
  psVar6 = cmMakefile::GetSafeDefinition(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_28 = psVar6;
  pcVar7 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)prop_local);
  psVar6 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(pcVar7);
  pcVar7 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)prop_local);
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_88);
  cmGeneratorExpression::Split
            ((string *)target_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_88);
  _Var1 = std::operator==(psVar6,parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __range1._6_1_ = 0;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_88);
  li = (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_88);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&li);
    if (!bVar2) {
      local_26c = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
      return (bool)((__range1._6_1_ ^ 0xff) & 1);
    }
    input = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
    sVar8 = cmGeneratorExpression::Find(input);
    if (sVar8 != 0) {
      str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)input);
      bVar2 = cmHasLiteralPrefix<18ul>(str,(char (*) [18])0xc484df);
      if (!bVar2) {
        local_cc = FATAL_ERROR;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
        if (sVar8 == 0xffffffffffffffff) {
LAB_0061e1ab:
          bVar2 = cmsys::SystemTools::FileIsFullPath(input);
          if (!bVar2) {
            poVar9 = std::operator<<((ostream *)local_248,"Target \"");
            psVar10 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)prop_local);
            poVar9 = std::operator<<(poVar9,(string *)psVar10);
            poVar9 = std::operator<<(poVar9,"\" ");
            poVar9 = std::operator<<(poVar9,(string *)installDir);
            poVar9 = std::operator<<(poVar9," property contains relative path:\n  \"");
            poVar9 = std::operator<<(poVar9,(string *)input);
            std::operator<<(poVar9,"\"");
            pcVar7 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)prop_local);
            std::__cxx11::ostringstream::str();
            cmLocalGenerator::IssueMessage(pcVar7,local_cc,(string *)local_290);
            std::__cxx11::string::~string((string *)local_290);
          }
          bVar2 = isSubDirectory(input,parts.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar3 = isSubDirectory(input,psVar6);
          bVar4 = isSubDirectory(input,local_28);
          if (bVar4) {
            if (bVar2) {
              bVar4 = isSubDirectory(local_28,parts.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_519 = false;
              if (bVar4) goto LAB_0061e3ba;
            }
            else {
LAB_0061e3ba:
              local_51a = true;
              if (bVar3) {
                local_51a = isSubDirectory(local_28,psVar6);
              }
              local_519 = local_51a;
            }
            local_293 = local_519;
            bVar4 = std::operator==(installDir,"INTERFACE_INCLUDE_DIRECTORIES");
            if ((bVar4) && (local_519 == false)) {
              PVar5 = cmGeneratorTarget::GetPolicyStatusCMP0052((cmGeneratorTarget *)prop_local);
              if (PVar5 != OLD) {
                if (PVar5 != WARN) goto LAB_0061e706;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_430,(cmPolicies *)0x34,id_00);
                poVar9 = std::operator<<((ostream *)local_410,(string *)&local_430);
                std::operator<<(poVar9,"\n");
                std::__cxx11::string::~string((string *)&local_430);
                poVar9 = std::operator<<((ostream *)local_410,"Directory:\n    \"");
                poVar9 = std::operator<<(poVar9,(string *)input);
                poVar9 = std::operator<<(poVar9,"\"\nin INTERFACE_INCLUDE_DIRECTORIES of target \"")
                ;
                psVar10 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)prop_local);
                poVar9 = std::operator<<(poVar9,(string *)psVar10);
                poVar9 = std::operator<<(poVar9,
                                         "\" is a subdirectory of the install directory:\n    \"");
                poVar9 = std::operator<<(poVar9,(string *)local_28);
                poVar9 = std::operator<<(poVar9,"\"\nhowever it is also a subdirectory of the ");
                pcVar11 = "source";
                if (bVar2) {
                  pcVar11 = "build";
                }
                poVar9 = std::operator<<(poVar9,pcVar11);
                poVar9 = std::operator<<(poVar9," tree:\n    \"");
                local_580 = psVar6;
                if (bVar2) {
                  local_580 = parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                poVar9 = std::operator<<(poVar9,(string *)local_580);
                std::operator<<(poVar9,"\"\n");
                pcVar7 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)prop_local);
                std::__cxx11::ostringstream::str();
                cmLocalGenerator::IssueMessage(pcVar7,AUTHOR_WARNING,&local_450);
                std::__cxx11::string::~string((string *)&local_450);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
              }
              local_293 = true;
            }
LAB_0061e706:
            if (local_293 != false) {
              local_26c = 3;
              goto LAB_0061e9da;
            }
          }
          if (bVar2) {
            poVar9 = std::operator<<((ostream *)local_248,"Target \"");
            psVar10 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)prop_local);
            poVar9 = std::operator<<(poVar9,(string *)psVar10);
            poVar9 = std::operator<<(poVar9,"\" ");
            poVar9 = std::operator<<(poVar9,(string *)installDir);
            poVar9 = std::operator<<(poVar9," property contains path:\n  \"");
            poVar9 = std::operator<<(poVar9,(string *)input);
            std::operator<<(poVar9,"\"\nwhich is prefixed in the build directory.");
            pcVar7 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)prop_local);
            std::__cxx11::ostringstream::str();
            cmLocalGenerator::IssueMessage(pcVar7,local_cc,&local_470);
            std::__cxx11::string::~string((string *)&local_470);
          }
          if ((!_Var1) && (bVar3)) {
            poVar9 = std::operator<<((ostream *)local_248,"Target \"");
            psVar10 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)prop_local);
            poVar9 = std::operator<<(poVar9,(string *)psVar10);
            poVar9 = std::operator<<(poVar9,"\" ");
            poVar9 = std::operator<<(poVar9,(string *)installDir);
            poVar9 = std::operator<<(poVar9," property contains path:\n  \"");
            poVar9 = std::operator<<(poVar9,(string *)input);
            std::operator<<(poVar9,"\"\nwhich is prefixed in the source directory.");
            pcVar7 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)prop_local);
            std::__cxx11::ostringstream::str();
            cmLocalGenerator::IssueMessage(pcVar7,local_cc,&local_490);
            std::__cxx11::string::~string((string *)&local_490);
          }
          local_26c = 0;
        }
        else {
          bVar2 = std::operator==(installDir,"INTERFACE_INCLUDE_DIRECTORIES");
          if (!bVar2) {
            __range1._6_1_ = 1;
            goto LAB_0061e1ab;
          }
          PVar5 = cmGeneratorTarget::GetPolicyStatusCMP0041((cmGeneratorTarget *)prop_local);
          if (PVar5 != OLD) {
            if (PVar5 == WARN) {
              local_cc = WARNING;
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_268,(cmPolicies *)0x29,id);
              poVar9 = std::operator<<((ostream *)local_248,(string *)&local_268);
              std::operator<<(poVar9,"\n");
              std::__cxx11::string::~string((string *)&local_268);
            }
            else if (PVar5 - NEW < 3) {
              __range1._6_1_ = 1;
            }
            goto LAB_0061e1ab;
          }
          local_26c = 3;
        }
LAB_0061e9da:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

static bool checkInterfaceDirs(const std::string& prepro,
                               cmGeneratorTarget const* target,
                               const std::string& prop)
{
  std::string const& installDir =
    target->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
  std::string const& topSourceDir =
    target->GetLocalGenerator()->GetSourceDirectory();
  std::string const& topBinaryDir =
    target->GetLocalGenerator()->GetBinaryDirectory();

  std::vector<std::string> parts;
  cmGeneratorExpression::Split(prepro, parts);

  const bool inSourceBuild = topSourceDir == topBinaryDir;

  bool hadFatalError = false;

  for (std::string const& li : parts) {
    size_t genexPos = cmGeneratorExpression::Find(li);
    if (genexPos == 0) {
      continue;
    }
    if (cmHasLiteralPrefix(li, "${_IMPORT_PREFIX}")) {
      continue;
    }
    MessageType messageType = MessageType::FATAL_ERROR;
    std::ostringstream e;
    if (genexPos != std::string::npos) {
      if (prop == "INTERFACE_INCLUDE_DIRECTORIES") {
        switch (target->GetPolicyStatusCMP0041()) {
          case cmPolicies::WARN:
            messageType = MessageType::WARNING;
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0041) << "\n";
            break;
          case cmPolicies::OLD:
            continue;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            hadFatalError = true;
            break; // Issue fatal message.
        }
      } else {
        hadFatalError = true;
      }
    }
    if (!cmSystemTools::FileIsFullPath(li)) {
      /* clang-format off */
      e << "Target \"" << target->GetName() << "\" " << prop <<
           " property contains relative path:\n"
           "  \"" << li << "\"";
      /* clang-format on */
      target->GetLocalGenerator()->IssueMessage(messageType, e.str());
    }
    bool inBinary = isSubDirectory(li, topBinaryDir);
    bool inSource = isSubDirectory(li, topSourceDir);
    if (isSubDirectory(li, installDir)) {
      // The include directory is inside the install tree.  If the
      // install tree is not inside the source tree or build tree then
      // fall through to the checks below that the include directory is not
      // also inside the source tree or build tree.
      bool shouldContinue =
        (!inBinary || isSubDirectory(installDir, topBinaryDir)) &&
        (!inSource || isSubDirectory(installDir, topSourceDir));

      if (prop == "INTERFACE_INCLUDE_DIRECTORIES") {
        if (!shouldContinue) {
          switch (target->GetPolicyStatusCMP0052()) {
            case cmPolicies::WARN: {
              std::ostringstream s;
              s << cmPolicies::GetPolicyWarning(cmPolicies::CMP0052) << "\n";
              s << "Directory:\n    \"" << li
                << "\"\nin "
                   "INTERFACE_INCLUDE_DIRECTORIES of target \""
                << target->GetName()
                << "\" is a subdirectory of the install "
                   "directory:\n    \""
                << installDir
                << "\"\nhowever it is also "
                   "a subdirectory of the "
                << (inBinary ? "build" : "source") << " tree:\n    \""
                << (inBinary ? topBinaryDir : topSourceDir) << "\"\n";
              target->GetLocalGenerator()->IssueMessage(
                MessageType::AUTHOR_WARNING, s.str());
              CM_FALLTHROUGH;
            }
            case cmPolicies::OLD:
              shouldContinue = true;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
          }
        }
      }
      if (shouldContinue) {
        continue;
      }
    }
    if (inBinary) {
      /* clang-format off */
      e << "Target \"" << target->GetName() << "\" " << prop <<
           " property contains path:\n"
           "  \"" << li << "\"\nwhich is prefixed in the build directory.";
      /* clang-format on */
      target->GetLocalGenerator()->IssueMessage(messageType, e.str());
    }
    if (!inSourceBuild) {
      if (inSource) {
        e << "Target \"" << target->GetName() << "\" " << prop
          << " property contains path:\n"
             "  \""
          << li << "\"\nwhich is prefixed in the source directory.";
        target->GetLocalGenerator()->IssueMessage(messageType, e.str());
      }
    }
  }
  return !hadFatalError;
}